

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O2

void test_common<unsigned_char>(uint length,uchar value)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  uint i;
  uchar *puVar4;
  undefined8 *puVar5;
  ulong uVar6;
  uchar *local_50;
  shared_ptr<unsigned_char> pa;
  shared_ptr<unsigned_char> pb;
  
  uVar3 = (ulong)length;
  puVar4 = sse::common::malloc<unsigned_char>(length + 1);
  std::__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<unsigned_char,void(*)(unsigned_char*),void>
            ((__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *)&local_50,puVar4,
             sse::common::free<unsigned_char>);
  puVar4 = sse::common::malloc<unsigned_char>(length + 1);
  std::__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<unsigned_char,void(*)(unsigned_char*),void>
            ((__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *)
             &pa.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount,puVar4,
             sse::common::free<unsigned_char>);
  local_50[uVar3] = '\x7f';
  *(undefined1 *)
   ((long)&(pa.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + uVar3) = 0x3f;
  nosimd::common::set<unsigned_char>(value,local_50,length);
  uVar6 = 0;
  while (uVar3 != uVar6) {
    puVar4 = local_50 + uVar6;
    uVar6 = uVar6 + 1;
    if (*puVar4 != value) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar5 = "void test_common(unsigned int, T) [T = unsigned char]";
      *(undefined4 *)(puVar5 + 1) = 0x16;
      *(uint *)((long)puVar5 + 0xc) = length;
      __cxa_throw(puVar5,&Exception::typeinfo,0);
    }
  }
  nosimd::common::copy<unsigned_char>
            (local_50,(uchar *)pa.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi,length);
  uVar6 = 0;
  while (uVar3 != uVar6) {
    puVar4 = (uchar *)((long)&(pa.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar6);
    uVar6 = uVar6 + 1;
    if (*puVar4 != value) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar5 = "void test_common(unsigned int, T) [T = unsigned char]";
      *(undefined4 *)(puVar5 + 1) = 0x1d;
      *(uint *)((long)puVar5 + 0xc) = length;
      __cxa_throw(puVar5,&Exception::typeinfo,0);
    }
  }
  sse::common::zero<unsigned_char>
            ((uchar *)pa.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi,length);
  uVar6 = 0;
  while (uVar3 != uVar6) {
    pcVar2 = (char *)((long)&(pa.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar6);
    uVar6 = uVar6 + 1;
    if (*pcVar2 != '\0') {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar5 = "void test_common(unsigned int, T) [T = unsigned char]";
      *(undefined4 *)(puVar5 + 1) = 0x24;
      *(uint *)((long)puVar5 + 0xc) = length;
      __cxa_throw(puVar5,&Exception::typeinfo,0);
    }
  }
  for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    local_50[uVar6] = (uchar)uVar6;
  }
  nosimd::common::copy<unsigned_char>
            (local_50,(uchar *)pa.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi,length);
  uVar6 = 0;
  while (uVar3 != uVar6) {
    uVar1 = uVar6 + 1;
    pcVar2 = (char *)((long)&(pa.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar6);
    uVar6 = uVar1;
    if ((char)((char)uVar1 + -1) != *pcVar2) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar5 = "void test_common(unsigned int, T) [T = unsigned char]";
      *(undefined4 *)(puVar5 + 1) = 0x2d;
      *(uint *)((long)puVar5 + 0xc) = length;
      __cxa_throw(puVar5,&Exception::typeinfo,0);
    }
  }
  if ((local_50[uVar3] == '\x7f') &&
     (*(char *)((long)&(pa.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_vptr__Sp_counted_base + uVar3) == '?')) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa);
    return;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar5 = "void test_common(unsigned int, T) [T = unsigned char]";
  *(undefined4 *)(puVar5 + 1) = 0x31;
  *(uint *)((long)puVar5 + 0xc) = length;
  __cxa_throw(puVar5,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}